

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.h
# Opt level: O0

void bcf_enc_int1(kstring_t *s,int32_t x)

{
  int32_t local_1c;
  undefined2 local_16;
  int32_t z_1;
  int16_t z;
  kstring_t *pkStack_10;
  int32_t x_local;
  kstring_t *s_local;
  
  z_1 = x;
  pkStack_10 = s;
  if (x == -0x7fffffff) {
    bcf_enc_size(s,1,1);
    kputc(-0x7f,pkStack_10);
  }
  else if (x == -0x80000000) {
    bcf_enc_size(s,1,1);
    kputc(-0x80,pkStack_10);
  }
  else if ((x < 0x80) && (-0x80 < x)) {
    bcf_enc_size(s,1,1);
    kputc(z_1,pkStack_10);
  }
  else if ((x < 0x8000) && (-0x8000 < x)) {
    local_16 = (undefined2)x;
    bcf_enc_size(s,1,2);
    kputsn((char *)&local_16,2,pkStack_10);
  }
  else {
    local_1c = x;
    bcf_enc_size(s,1,3);
    kputsn((char *)&local_1c,4,pkStack_10);
  }
  return;
}

Assistant:

static inline void bcf_enc_int1(kstring_t *s, int32_t x)
{
    if (x == bcf_int32_vector_end) {
        bcf_enc_size(s, 1, BCF_BT_INT8);
        kputc(bcf_int8_vector_end, s);
    } else if (x == bcf_int32_missing) {
        bcf_enc_size(s, 1, BCF_BT_INT8);
        kputc(bcf_int8_missing, s);
    } else if (x <= INT8_MAX && x > bcf_int8_missing) {
        bcf_enc_size(s, 1, BCF_BT_INT8);
        kputc(x, s);
    } else if (x <= INT16_MAX && x > bcf_int16_missing) {
        int16_t z = x;
        bcf_enc_size(s, 1, BCF_BT_INT16);
        kputsn((char*)&z, 2, s);
    } else {
        int32_t z = x;
        bcf_enc_size(s, 1, BCF_BT_INT32);
        kputsn((char*)&z, 4, s);
    }
}